

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int destroy(gz_stream *s)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int err;
  gz_stream *s_local;
  
  local_1c = 0;
  if (s == (gz_stream *)0x0) {
    s_local._4_4_ = -2;
  }
  else {
    if (s->msg != (char *)0x0) {
      free(s->msg);
    }
    if ((s->stream).state != (internal_state *)0x0) {
      if (s->mode == 'w') {
        local_1c = cm_zlib_deflateEnd((z_streamp)s);
      }
      else if (s->mode == 'r') {
        local_1c = cm_zlib_inflateEnd(&s->stream);
      }
    }
    if (((s->file != (FILE *)0x0) && (iVar1 = fclose((FILE *)s->file), iVar1 != 0)) &&
       (piVar2 = __errno_location(), *piVar2 != 0x1d)) {
      local_1c = -1;
    }
    if (s->z_err < 0) {
      local_1c = s->z_err;
    }
    if (s->inbuf != (Byte *)0x0) {
      free(s->inbuf);
    }
    if (s->outbuf != (Byte *)0x0) {
      free(s->outbuf);
    }
    if (s->path != (char *)0x0) {
      free(s->path);
    }
    if (s != (gz_stream *)0x0) {
      free(s);
    }
    s_local._4_4_ = local_1c;
  }
  return s_local._4_4_;
}

Assistant:

local int destroy (s)
    gz_stream *s;
{
    int err = Z_OK;

    if (!s) return Z_STREAM_ERROR;

    TRYFREE(s->msg);

    if (s->stream.state != NULL) {
        if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
            err = Z_STREAM_ERROR;
#else
            err = deflateEnd(&(s->stream));
#endif
        } else if (s->mode == 'r') {
            err = inflateEnd(&(s->stream));
        }
    }
    if (s->file != NULL && fclose(s->file)) {
#ifdef ESPIPE
        if (errno != ESPIPE) /* fclose is broken for pipes in HP/UX */
#endif
            err = Z_ERRNO;
    }
    if (s->z_err < 0) err = s->z_err;

    TRYFREE(s->inbuf);
    TRYFREE(s->outbuf);
    TRYFREE(s->path);
    TRYFREE(s);
    return err;
}